

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_ffh_string_reverse(lua_State *L)

{
  GCstr *pGVar1;
  
  pGVar1 = lj_lib_checkstr(L,1);
  lj_str_needbuf(L,(SBuf *)((ulong)(L->glref).ptr32 + 0x58),pGVar1->len);
  return 0;
}

Assistant:

LJLIB_ASM(string_reverse)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  lj_str_needbuf(L, &G(L)->tmpbuf, s->len);
  return FFH_RETRY;
}